

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ReadExportSection(WasmBinaryReader *this)

{
  SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  Type pWVar2;
  code *pcVar3;
  NameList *string1;
  bool bVar4;
  ExternalKinds kind;
  int iVar5;
  uint index;
  Type funcType;
  uint32 uVar6;
  uint iExport;
  uint uVar7;
  LocalFunctionId LVar8;
  undefined4 *puVar9;
  Type *ppcVar10;
  WasmGlobal *pWVar11;
  WasmFunctionInfo *pWVar12;
  WebAssemblyModule *this_00;
  WasmBinaryReader *pWVar13;
  FunctionProxy *pFVar14;
  ulong count;
  undefined1 local_138 [8];
  ArenaAllocator tmpAlloc;
  BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  exportsNameDict;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint32 local_58 [2];
  uint32 length;
  NameList *list;
  char16 *exportName;
  WebAssemblyModule *pWStack_38;
  uint32 nameLength;
  
  pWVar13 = this;
  local_58[1] = LEB128<unsigned_int,32u>(this,local_58);
  if ((100000 < local_58[1]) && (DAT_01430302 == '\0')) {
    ThrowDecodingError(pWVar13,L"Too many exports");
  }
  Js::WebAssemblyModule::AllocateFunctionExports(this->m_module,local_58[1]);
  pWStack_38 = (WebAssemblyModule *)this;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_138,
             L"ExportDupCheck",
             &(((((((this->m_module->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               threadContext->pageAllocator).super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  tmpAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       (void *)0x0;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_68._0_8_ = &DAT_01453738;
  local_68._8_8_ = L"Unknown global %u for export %s";
  iExport = 0;
  do {
    if (iExport == local_58[1]) {
      JsUtil::
      BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)&tmpAlloc.
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            .freeList);
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
      ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          local_138);
      return;
    }
    list = (NameList *)
           ReadInlineName((WasmBinaryReader *)pWStack_38,local_58,(uint *)((long)&exportName + 4));
    _length = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    bVar4 = JsUtil::
            BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>
                      ((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        *)&tmpAlloc.
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           freeList,(uint *)((long)&exportName + 4),
                       (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> **)&length);
    string1 = list;
    if (bVar4) {
      count = (ulong)exportName._4_4_;
      local_78._0_8_ = _length;
      local_78._8_8_ = _length;
      while( true ) {
        if ((SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)local_78._8_8_ ==
            (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
        pSVar1 = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)
                 (((SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)local_78._8_8_)
                 ->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (pSVar1 == (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)local_78._0_8_)
        break;
        local_78._8_8_ = pSVar1;
        ppcVar10 = SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)local_78);
        iVar5 = PAL_wcsncmp((char16_t *)string1,*ppcVar10,count);
        if (iVar5 == 0) {
          pWVar13 = (WasmBinaryReader *)local_78;
          SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                    ((Iterator *)pWVar13);
          ThrowDecodingError(pWVar13,L"Duplicate export name: %s",list);
        }
      }
    }
    else {
      _length = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)
                new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)local_138,0x35916e);
      (_length->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)_length;
      (_length->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
      super_RealCount.count = 0;
      _length->allocator = (ArenaAllocator *)local_138;
      JsUtil::
      BaseDictionary<unsigned_int,SList<char16_t_const*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,SList<char16_t_const*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,SList<char16_t_const*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&tmpAlloc.
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     freeList,(uint *)((long)&exportName + 4),
                 (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> **)&length);
    }
    SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>::Prepend(_length,(char16_t **)&list);
    this_00 = pWStack_38;
    kind = ReadConst<unsigned_char>((WasmBinaryReader *)pWStack_38);
    index = LEB128<unsigned_int,32u>((WasmBinaryReader *)this_00,local_58);
    switch(kind) {
    case Function:
      funcType = Js::WebAssemblyModule::GetFunctionIndexType
                           ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,index);
      pWVar13 = (WasmBinaryReader *)(ulong)(uint)funcType;
      bVar4 = FunctionIndexTypes::CanBeExported(funcType);
      if (!bVar4) {
        ThrowDecodingError(pWVar13,L"Invalid Export %u => func[%u]",(ulong)iExport,(ulong)index);
      }
      Js::WebAssemblyModule::SetExport
                ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,iExport,index,(char16 *)list,
                 exportName._4_4_,Function);
      if (funcType == ImportThunk) {
        pWVar12 = Js::WebAssemblyModule::GetWasmFunctionInfo
                            ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,index);
        pWVar2 = pWVar12->importedFunctionReference;
        pFVar14 = (FunctionProxy *)(pWStack_38->m_memImport).ptr;
        if (pFVar14 == (FunctionProxy *)0x0 || pWStack_38->m_importedFunctionCount != 1) {
          bVar4 = Js::Phases::IsEnabled((Phases *)local_68._0_8_,WasmReaderPhase);
        }
        else {
          uVar7 = Js::FunctionProxy::GetSourceContextId(pFVar14);
          if (pWStack_38->m_importedFunctionCount == 1) {
            pFVar14 = (FunctionProxy *)(pWStack_38->m_memImport).ptr;
          }
          else {
            pFVar14 = (FunctionProxy *)0x0;
          }
          LVar8 = Js::FunctionProxy::GetLocalFunctionId(pFVar14);
          bVar4 = Js::Phases::IsEnabled((Phases *)local_68._0_8_,WasmReaderPhase,uVar7,LVar8);
        }
        if (bVar4 != false) {
          Output::Print(L"Export #%u: Import(%s.%s)(%u) => %s",(ulong)iExport,pWVar2->modName,
                        pWVar2->importName,(ulong)index);
          Output::Print(L"\n");
          Output::Flush();
        }
      }
      else {
        pFVar14 = (FunctionProxy *)(pWStack_38->m_memImport).ptr;
        if (pFVar14 == (FunctionProxy *)0x0 || pWStack_38->m_importedFunctionCount != 1) {
          bVar4 = Js::Phases::IsEnabled((Phases *)local_68._0_8_,WasmReaderPhase);
        }
        else {
          uVar7 = Js::FunctionProxy::GetSourceContextId(pFVar14);
          if (pWStack_38->m_importedFunctionCount == 1) {
            pFVar14 = (FunctionProxy *)(pWStack_38->m_memImport).ptr;
          }
          else {
            pFVar14 = (FunctionProxy *)0x0;
          }
          LVar8 = Js::FunctionProxy::GetLocalFunctionId(pFVar14);
          bVar4 = Js::Phases::IsEnabled((Phases *)local_68._0_8_,WasmReaderPhase,uVar7,LVar8);
        }
        if (bVar4 != false) {
          Output::Print(L"Export #%u: Function(%u) => %s",(ulong)iExport,(ulong)index,list);
          Output::Print(L"\n");
          Output::Flush();
        }
      }
      goto LAB_00d63ac7;
    case Table:
      if (index != 0) {
        local_68._8_8_ = L"Unknown table index %u for export %s";
        goto LAB_00d63c7f;
      }
      break;
    case Memory:
      if (index != 0) {
        local_68._8_8_ = L"Unknown memory index %u for export %s";
        goto LAB_00d63c7f;
      }
      break;
    case Global:
      this_00 = (WebAssemblyModule *)(pWStack_38->m_datasegs).ptr;
      uVar6 = Js::WebAssemblyModule::GetGlobalCount(this_00);
      if (uVar6 <= index) {
LAB_00d63c7f:
        ThrowDecodingError((WasmBinaryReader *)this_00,(char16 *)local_68._8_8_,(ulong)index,list);
      }
      this_00 = (WebAssemblyModule *)(pWStack_38->m_datasegs).ptr;
      pWVar11 = Js::WebAssemblyModule::GetGlobal(this_00,index);
      if (pWVar11->m_isMutable != false) {
        local_68._8_8_ = L"Mutable globals cannot be exported";
        goto LAB_00d63c7f;
      }
      goto LAB_00d63aa7;
    default:
      ThrowDecodingError((WasmBinaryReader *)this_00,L"Exported Kind %d, NYI",(ulong)kind);
    }
    index = 0;
LAB_00d63aa7:
    Js::WebAssemblyModule::SetExport
              ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,iExport,index,(char16 *)list,
               exportName._4_4_,kind);
LAB_00d63ac7:
    iExport = iExport + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::ReadExportSection()
{
    uint32 length;
    uint32 numExports = LEB128(length);
    if (numExports > Limits::GetMaxExports())
    {
        ThrowDecodingError(_u("Too many exports"));
    }

    m_module->AllocateFunctionExports(numExports);

    ArenaAllocator tmpAlloc(_u("ExportDupCheck"), m_module->GetScriptContext()->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory);
    typedef SList<const char16*> NameList;
    JsUtil::BaseDictionary<uint32, NameList*, ArenaAllocator> exportsNameDict(&tmpAlloc);

    for (uint32 iExport = 0; iExport < numExports; iExport++)
    {
        uint32 nameLength;
        const char16* exportName = ReadInlineName(length, nameLength);

        // Check if the name is already used
        NameList* list = nullptr;
        if (exportsNameDict.TryGetValue(nameLength, &list))
        {
            const char16** found = list->Find([exportName, nameLength](const char16* existing) { 
                return wcsncmp(exportName, existing, nameLength) == 0;
            });
            if (found)
            {
                ThrowDecodingError(_u("Duplicate export name: %s"), exportName);
            }
        }
        else
        {
            list = Anew(&tmpAlloc, NameList, &tmpAlloc);
            exportsNameDict.Add(nameLength, list);
        }
        list->Push(exportName);

        ExternalKinds kind = ReadExternalKind();
        uint32 index = LEB128(length);
        switch (kind)
        {
        case ExternalKinds::Function:
        {
            FunctionIndexTypes::Type type = m_module->GetFunctionIndexType(index);
            if (!FunctionIndexTypes::CanBeExported(type))
            {
                ThrowDecodingError(_u("Invalid Export %u => func[%u]"), iExport, index);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);

#if DBG_DUMP
            if (type == FunctionIndexTypes::ImportThunk)
            {
                WasmImport* import = m_module->GetWasmFunctionInfo(index)->importedFunctionReference;
                TRACE_WASM_DECODER(_u("Export #%u: Import(%s.%s)(%u) => %s"), iExport, import->modName, import->importName, index, exportName);
            }
            else
            {
                TRACE_WASM_DECODER(_u("Export #%u: Function(%u) => %s"), iExport, index, exportName);
            }
#endif
            break;
        }
        case ExternalKinds::Memory:
            if (index != 0)
            {
                ThrowDecodingError(_u("Unknown memory index %u for export %s"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        case ExternalKinds::Table:
            if (index != 0)
            {
                ThrowDecodingError(_u("Unknown table index %u for export %s"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        case ExternalKinds::Global:
            if (index >= m_module->GetGlobalCount())
            {
                ThrowDecodingError(_u("Unknown global %u for export %s"), index, exportName);
            }
            if (m_module->GetGlobal(index)->IsMutable())
            {
                ThrowDecodingError(_u("Mutable globals cannot be exported"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        default:
            ThrowDecodingError(_u("Exported Kind %d, NYI"), kind);
            break;
        }

    }
}